

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMap.c
# Opt level: O2

Abc_Obj_t *
Abc_NodeFromMapSuperChoice_rec
          (Abc_Ntk_t *pNtkNew,Map_Super_t *pSuper,Abc_Obj_t **pNodePis,int nNodePis)

{
  Mem_Flex_t *pMan;
  uint uVar1;
  int iVar2;
  Mio_Library_t *pLib;
  Mio_Gate_t *pMVar3;
  char *pcVar4;
  Map_Super_t **ppMVar5;
  Abc_Obj_t *pAVar6;
  Abc_Obj_t *pFanin;
  ulong uVar7;
  ulong uVar8;
  
  uVar8 = 0;
  pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
  pMVar3 = Map_SuperReadRoot(pSuper);
  if (pMVar3 == (Mio_Gate_t *)0x0) {
    iVar2 = Map_SuperReadNum(pSuper);
    if (nNodePis <= iVar2) {
      pAVar6 = Abc_NtkCreateNodeConst0(pNtkNew);
      return pAVar6;
    }
    pAVar6 = pNodePis[iVar2];
  }
  else {
    pcVar4 = Mio_GateReadName(pMVar3);
    pMVar3 = Mio_LibraryReadGateByName(pLib,pcVar4,(char *)0x0);
    uVar1 = Map_SuperReadFaninNum(pSuper);
    ppMVar5 = Map_SuperReadFanins(pSuper);
    pAVar6 = Abc_NtkCreateNode(pNtkNew);
    uVar7 = 0;
    if (0 < (int)uVar1) {
      uVar7 = (ulong)uVar1;
    }
    for (; uVar7 != uVar8; uVar8 = uVar8 + 1) {
      pFanin = Abc_NodeFromMapSuperChoice_rec(pNtkNew,ppMVar5[uVar8],pNodePis,nNodePis);
      Abc_ObjAddFanin(pAVar6,pFanin);
    }
    pMan = (Mem_Flex_t *)pNtkNew->pManFunc;
    pcVar4 = Mio_GateReadSop(pMVar3);
    pcVar4 = Abc_SopRegister(pMan,pcVar4);
    (pAVar6->field_5).pData = pcVar4;
  }
  return pAVar6;
}

Assistant:

Abc_Obj_t * Abc_NodeFromMapSuperChoice_rec( Abc_Ntk_t * pNtkNew, Map_Super_t * pSuper, Abc_Obj_t * pNodePis[], int nNodePis )
{
    Mio_Library_t * pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
    Mio_Gate_t * pRoot;
    Map_Super_t ** ppFanins;
    Abc_Obj_t * pNodeNew, * pNodeFanin;
    int nFanins, Number, i;

    // get the parameters of the supergate
    pRoot = Map_SuperReadRoot(pSuper);
    if ( pRoot == NULL )
    {
        Number = Map_SuperReadNum(pSuper);
        if ( Number < nNodePis )  
        {
            return pNodePis[Number];
        }
        else
        {  
//            assert( 0 );
            /* It might happen that a super gate with 5 inputs is constructed that
             * actually depends only on the first four variables; i.e the fifth is a
             * don't care -- in that case we connect constant node for the fifth
             * (since the cut only has 4 variables). An interesting question is what
             * if the first variable (and not the fifth one is the redundant one;
             * can that happen?) */
            return Abc_NtkCreateNodeConst0(pNtkNew);
        }
    }
    pRoot = Mio_LibraryReadGateByName( pLib, Mio_GateReadName(pRoot), NULL );

    // get information about the fanins of the supergate
    nFanins  = Map_SuperReadFaninNum( pSuper );
    ppFanins = Map_SuperReadFanins( pSuper );
    // create a new node with these fanins
    pNodeNew = Abc_NtkCreateNode( pNtkNew );
    for ( i = 0; i < nFanins; i++ )
    {
        pNodeFanin = Abc_NodeFromMapSuperChoice_rec( pNtkNew, ppFanins[i], pNodePis, nNodePis );
        Abc_ObjAddFanin( pNodeNew, pNodeFanin );
    }
    pNodeNew->pData = Abc_SopRegister( (Mem_Flex_t *)pNtkNew->pManFunc, Mio_GateReadSop(pRoot) );
    return pNodeNew;
}